

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::XmlSerializer::ReadBaseMaterials(XmlSerializer *this)

{
  XmlReader *pXVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  undefined4 extraout_var;
  pointer ppVar5;
  mapped_type *pmVar6;
  aiMaterial *local_78;
  value_type_conflict4 local_6c;
  iterator local_68;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_60;
  iterator local_58;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_50;
  const_iterator it;
  size_t newMatIdx;
  uint id;
  char *local_30;
  char *baseMaterialId;
  vector<unsigned_int,_std::allocator<unsigned_int>_> MatIdArray;
  XmlSerializer *this_local;
  
  MatIdArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&baseMaterialId);
  pXVar1 = this->xmlReader;
  uVar4 = std::__cxx11::string::c_str();
  iVar3 = (*pXVar1->_vptr_IIrrXMLReader[7])(pXVar1,uVar4);
  local_30 = (char *)CONCAT44(extraout_var,iVar3);
  if (local_30 != (char *)0x0) {
    newMatIdx._0_4_ = atoi(local_30);
    it._M_node = (_Base_ptr)
                 std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(&this->mMatArray);
    if ((uint)newMatIdx != this->mActiveMatGroup) {
      this->mActiveMatGroup = (uint)newMatIdx;
      local_58._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::find(&this->mMatId2MatArray,(key_type *)&newMatIdx);
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::_Rb_tree_const_iterator(&local_50,&local_58);
      local_68._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::end(&this->mMatId2MatArray);
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::_Rb_tree_const_iterator(&local_60,&local_68);
      bVar2 = std::operator==(&local_60,&local_50);
      if (bVar2) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&baseMaterialId);
        pmVar6 = std::
                 map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->mMatId2MatArray,(key_type *)&newMatIdx);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (pmVar6,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&baseMaterialId);
      }
      else {
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator->(&local_50);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&baseMaterialId,
                   &ppVar5->second);
      }
    }
    local_6c = (value_type_conflict4)it._M_node;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&baseMaterialId,&local_6c);
    pmVar6 = std::
             map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](&this->mMatId2MatArray,&this->mActiveMatGroup);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (pmVar6,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&baseMaterialId);
  }
  while (bVar2 = ReadToEndElement(this,(string *)XmlTag::basematerials_abi_cxx11_), bVar2) {
    local_78 = readMaterialDef(this);
    std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(&this->mMatArray,&local_78);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&baseMaterialId);
  return;
}

Assistant:

void ReadBaseMaterials() {
        std::vector<unsigned int> MatIdArray;
        const char *baseMaterialId( xmlReader->getAttributeValue( D3MF::XmlTag::basematerials_id.c_str() ) );
        if ( nullptr != baseMaterialId ) {
            unsigned int id = std::atoi( baseMaterialId );
            const size_t newMatIdx( mMatArray.size() );
            if ( id != mActiveMatGroup ) {
                mActiveMatGroup = id;
                MatId2MatArray::const_iterator it( mMatId2MatArray.find( id ) );
                if ( mMatId2MatArray.end() == it ) {
                    MatIdArray.clear();
                    mMatId2MatArray[ id ] = MatIdArray;
                } else {
                    MatIdArray = it->second;
                }
            }
            MatIdArray.push_back( static_cast<unsigned int>( newMatIdx ) );
            mMatId2MatArray[ mActiveMatGroup ] = MatIdArray;
        }

        while ( ReadToEndElement( D3MF::XmlTag::basematerials ) ) {
            mMatArray.push_back( readMaterialDef() );
        }
    }